

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_abs64_aarch64(void *d,void *a,uint32_t desc)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar2 = desc * 8 & 0xff;
  uVar3 = 0;
  do {
    lVar1 = *(long *)((long)a + uVar3);
    lVar4 = -lVar1;
    if (0 < lVar1) {
      lVar4 = lVar1;
    }
    *(long *)((long)d + uVar3) = lVar4;
    uVar3 = uVar3 + 8;
  } while (uVar3 < uVar2 + 8);
  if ((desc >> 2 & 0xf8) <= uVar2) {
    return;
  }
  helper_gvec_abs64_aarch64_cold_1();
  return;
}

Assistant:

void HELPER(gvec_abs64)(void *d, void *a, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int64_t)) {
        int64_t aa = *(int64_t *)((char *)a + i);
        *(int64_t *)((char *)d + i) = aa < 0 ? -aa : aa;
    }
    clear_high(d, oprsz, desc);
}